

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  float *pfVar1;
  int in_ECX;
  int in_EDX;
  Mat *in_RDI;
  int in_R8D;
  int q_2;
  float *ktmp_2;
  float *k0_2;
  int p_2;
  int q_1;
  float *ktmp_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  int p_1;
  int pp_1;
  int q;
  float *ktmp;
  float *k7;
  float *k6;
  float *k5;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  float *kernel;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  size_t in_stack_fffffffffffffe18;
  Mat *pMVar2;
  undefined8 in_stack_fffffffffffffe20;
  int _c;
  undefined8 in_stack_fffffffffffffe28;
  Mat *in_stack_fffffffffffffe30;
  Mat *in_stack_fffffffffffffe38;
  int local_1b4;
  Mat local_1b0;
  float *local_168;
  float *local_160;
  int local_158;
  int local_154;
  Mat local_150;
  Mat *local_108;
  float *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  Mat local_c8;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float *local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  _c = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_28 = Mat::operator_cast_to_float_(in_RDI);
  Mat::create(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              (int)in_stack_fffffffffffffe28,_c,in_stack_fffffffffffffe18,
              (Allocator *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_2c = local_18 >> 3;
  local_30 = local_2c << 3;
  for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
    local_38 = local_34 * 8;
    local_40 = local_28 + local_38 * local_14 * local_1c;
    local_48 = local_28 + (local_38 + 1) * local_14 * local_1c;
    local_50 = local_28 + (local_38 + 2) * local_14 * local_1c;
    local_58 = local_28 + (local_38 + 3) * local_14 * local_1c;
    local_60 = local_28 + (local_38 + 4) * local_14 * local_1c;
    local_68 = local_28 + (local_38 + 5) * local_14 * local_1c;
    local_70 = local_28 + (local_38 + 6) * local_14 * local_1c;
    local_78 = local_28 + (local_38 + 7) * local_14 * local_1c;
    in_stack_fffffffffffffe38 = &local_c8;
    Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(in_stack_fffffffffffffe38);
    Mat::~Mat((Mat *)0x2c7390);
    local_80 = pfVar1;
    for (local_d8 = 0; local_d8 < local_14 * local_1c; local_d8 = local_d8 + 1) {
      *local_80 = *local_40;
      local_80[1] = *local_48;
      local_80[2] = *local_50;
      local_80[3] = *local_58;
      local_80[4] = *local_60;
      local_80[5] = *local_68;
      local_80[6] = *local_70;
      local_80[7] = *local_78;
      local_80 = local_80 + 8;
      local_40 = local_40 + 1;
      local_48 = local_48 + 1;
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
      local_60 = local_60 + 1;
      local_68 = local_68 + 1;
      local_70 = local_70 + 1;
      local_78 = local_78 + 1;
    }
  }
  local_2c = local_18 - local_30 >> 2;
  for (local_dc = 0; local_dc < local_2c; local_dc = local_dc + 1) {
    local_e0 = local_30 + local_dc * 4;
    local_e8 = local_28 + local_e0 * local_14 * local_1c;
    local_f0 = local_28 + (local_e0 + 1) * local_14 * local_1c;
    local_f8 = local_28 + (local_e0 + 2) * local_14 * local_1c;
    local_100 = local_28 + (local_e0 + 3) * local_14 * local_1c;
    pMVar2 = &local_150;
    Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    in_stack_fffffffffffffe30 = (Mat *)Mat::operator_cast_to_float_(pMVar2);
    Mat::~Mat((Mat *)0x2c7729);
    local_108 = in_stack_fffffffffffffe30;
    for (local_154 = 0; local_154 < local_14 * local_1c; local_154 = local_154 + 1) {
      *(float *)&local_108->data = *local_e8;
      *(float *)((long)&local_108->data + 4) = *local_f0;
      *(float *)&local_108->refcount = *local_f8;
      *(float *)((long)&local_108->refcount + 4) = *local_100;
      local_108 = (Mat *)&local_108->elemsize;
      local_e8 = local_e8 + 1;
      local_f0 = local_f0 + 1;
      local_f8 = local_f8 + 1;
      local_100 = local_100 + 1;
    }
  }
  local_158 = local_2c * 4 + local_30;
  local_30 = local_158;
  for (; local_158 < local_18; local_158 = local_158 + 1) {
    local_160 = local_28 + local_158 * local_14 * local_1c;
    pMVar2 = &local_1b0;
    Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(pMVar2);
    Mat::~Mat((Mat *)0x2c796a);
    local_168 = pfVar1;
    for (local_1b4 = 0; local_1b4 < local_14 * local_1c; local_1b4 = local_1b4 + 1) {
      *local_168 = *local_160;
      local_168 = local_168 + 1;
      local_160 = local_160 + 1;
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 8 x 8
    kernel_tm.create(8 * kernel_size, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 3;
    remain_outch_start = nn_outch << 3;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;
        const float* k4 = kernel + (p + 4) * inch * kernel_size;
        const float* k5 = kernel + (p + 5) * inch * kernel_size;
        const float* k6 = kernel + (p + 6) * inch * kernel_size;
        const float* k7 = kernel + (p + 7) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp[4] = k4[0];
            ktmp[5] = k5[0];
            ktmp[6] = k6[0];
            ktmp[7] = k7[0];
            ktmp += 8;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
            k4 += 1;
            k5 += 1;
            k6 += 1;
            k7 += 1;
        }
    }

    nn_outch = (outch - remain_outch_start) >> 2;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = remain_outch_start + pp * 4;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    for (int p = remain_outch_start; p < outch; p++)
    {
        const float* k0 = kernel + (p + 0) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4 + p % 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}